

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__fs_readdir(uv_fs_t *req)

{
  long *plVar1;
  int iVar2;
  uv_dirent_type_t uVar3;
  int *piVar4;
  dirent64 *dent;
  long *plVar5;
  char *pcVar6;
  uint local_38;
  uint local_34;
  uint i;
  uint dirent_idx;
  dirent *res;
  uv_dirent_t *dirent;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  plVar1 = (long *)req->ptr;
  local_34 = 0;
  while( true ) {
    if ((ulong)plVar1[1] <= (ulong)local_34) {
      return local_34;
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    dent = readdir64((DIR *)plVar1[6]);
    if (dent == (dirent64 *)0x0) break;
    iVar2 = strcmp(dent->d_name,".");
    if ((iVar2 != 0) && (iVar2 = strcmp(dent->d_name,".."), iVar2 != 0)) {
      plVar5 = (long *)(*plVar1 + (ulong)local_34 * 0x10);
      pcVar6 = uv__strdup(dent->d_name);
      *plVar5 = (long)pcVar6;
      if (*plVar5 == 0) {
LAB_0012720b:
        for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
          uv__free(*(void **)(*plVar1 + (ulong)local_38 * 0x10));
          *(undefined8 *)(*plVar1 + (ulong)local_38 * 0x10) = 0;
        }
        return -1;
      }
      uVar3 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
      *(uv_dirent_type_t *)(plVar5 + 1) = uVar3;
      local_34 = local_34 + 1;
    }
  }
  piVar4 = __errno_location();
  if (*piVar4 == 0) {
    return local_34;
  }
  goto LAB_0012720b;
}

Assistant:

static int uv__fs_readdir(uv_fs_t* req) {
  uv_dir_t* dir;
  uv_dirent_t* dirent;
  struct dirent* res;
  unsigned int dirent_idx;
  unsigned int i;

  dir = req->ptr;
  dirent_idx = 0;

  while (dirent_idx < dir->nentries) {
    /* readdir() returns NULL on end of directory, as well as on error. errno
       is used to differentiate between the two conditions. */
    errno = 0;
    res = readdir(dir->dir);

    if (res == NULL) {
      if (errno != 0)
        goto error;
      break;
    }

    if (strcmp(res->d_name, ".") == 0 || strcmp(res->d_name, "..") == 0)
      continue;

    dirent = &dir->dirents[dirent_idx];
    dirent->name = uv__strdup(res->d_name);

    if (dirent->name == NULL)
      goto error;

    dirent->type = uv__fs_get_dirent_type(res);
    ++dirent_idx;
  }

  return dirent_idx;

error:
  for (i = 0; i < dirent_idx; ++i) {
    uv__free((char*) dir->dirents[i].name);
    dir->dirents[i].name = NULL;
  }

  return -1;
}